

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O0

void __thiscall icu_63::Calendar::setTimeInMillis(Calendar *this,double millis,UErrorCode *status)

{
  UBool UVar1;
  int local_24;
  int32_t i;
  UErrorCode *status_local;
  double millis_local;
  Calendar *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (millis <= 1.838821689216e+17) {
      status_local = (UErrorCode *)millis;
      if (millis < -1.84303902528e+17) {
        UVar1 = isLenient(this);
        if (UVar1 == '\0') {
          *status = U_ILLEGAL_ARGUMENT_ERROR;
          return;
        }
        status_local = (UErrorCode *)0xc384763b62073280;
      }
    }
    else {
      UVar1 = isLenient(this);
      if (UVar1 == '\0') {
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return;
      }
      status_local = (UErrorCode *)0x43846a3eddf8cd80;
    }
    this->fTime = (UDate)status_local;
    this->fAreAllFieldsSet = '\0';
    this->fAreFieldsSet = '\0';
    this->fAreFieldsVirtuallySet = '\x01';
    this->fIsTimeSet = '\x01';
    for (local_24 = 0; local_24 < 0x17; local_24 = local_24 + 1) {
      this->fFields[local_24] = 0;
      this->fStamp[local_24] = 0;
      this->fIsSet[local_24] = '\0';
    }
  }
  return;
}

Assistant:

void
Calendar::setTimeInMillis( double millis, UErrorCode& status ) {
    if(U_FAILURE(status))
        return;

    if (millis > MAX_MILLIS) {
        if(isLenient()) {
            millis = MAX_MILLIS;
        } else {
		    status = U_ILLEGAL_ARGUMENT_ERROR;
		    return;
        }
    } else if (millis < MIN_MILLIS) {
        if(isLenient()) {
            millis = MIN_MILLIS;
        } else {
    		status = U_ILLEGAL_ARGUMENT_ERROR;
	    	return;
        }
    }

    fTime = millis;
    fAreFieldsSet = fAreAllFieldsSet = FALSE;
    fIsTimeSet = fAreFieldsVirtuallySet = TRUE;

    for (int32_t i=0; i<UCAL_FIELD_COUNT; ++i) {
        fFields[i]     = 0;
        fStamp[i]     = kUnset;
        fIsSet[i]     = FALSE;
    }


}